

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O0

int Gia_MuxMffcSize(Gia_Man_t *p,int iObj)

{
  int iVar1;
  int Count2;
  int Count1;
  int iObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsMuxId(p,iObj);
  if (iVar1 == 0) {
    p_local._4_4_ = 0;
  }
  else {
    p_local._4_4_ = Gia_MuxDeref(p,iObj);
    iVar1 = Gia_MuxRef(p,iObj);
    if (p_local._4_4_ != iVar1) {
      __assert_fail("Count1 == Count2",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMuxes.c"
                    ,0x116,"int Gia_MuxMffcSize(Gia_Man_t *, int)");
    }
  }
  return p_local._4_4_;
}

Assistant:

int Gia_MuxMffcSize( Gia_Man_t * p, int iObj )
{
    int Count1, Count2;
    if ( !Gia_ObjIsMuxId(p, iObj) )
        return 0;
    Count1 = Gia_MuxDeref( p, iObj );
    Count2 = Gia_MuxRef( p, iObj );
    assert( Count1 == Count2 );
    return Count1;
}